

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cc
# Opt level: O0

void rcg::getColor(uint8_t *rgb,shared_ptr<const_rcg::Image> *img,uint32_t ds,uint32_t i,uint32_t k)

{
  undefined1 uVar1;
  element_type *peVar2;
  uint64_t uVar3;
  size_t sVar4;
  size_t sVar5;
  long lVar6;
  uint8_t *puVar7;
  int in_ECX;
  byte *pbVar8;
  uint in_EDX;
  undefined1 *in_RDI;
  int in_R8D;
  uint8_t v_1 [3];
  uint32_t ii_3;
  uint32_t kk_3;
  uint32_t n_3;
  uint32_t b_2;
  uint32_t g_3;
  uint32_t r_2;
  uint8_t *p_3;
  size_t lstep_3;
  uint8_t v [3];
  uint32_t ii_2;
  uint32_t kk_2;
  uint32_t n_2;
  uint32_t b_1;
  uint32_t g_2;
  uint32_t r_1;
  uint8_t *p_2;
  size_t lstep_2;
  uint32_t ii_1;
  uint8_t *pp;
  uint32_t kk_1;
  uint32_t n_1;
  uint32_t b;
  uint32_t g_1;
  uint32_t r;
  uint8_t *p_1;
  size_t lstep_1;
  uint32_t ii;
  uint32_t kk;
  uint32_t n;
  uint32_t g;
  uint8_t *p;
  size_t lstep;
  undefined8 in_stack_ffffffffffffff20;
  undefined5 in_stack_ffffffffffffff28;
  byte in_stack_ffffffffffffff2d;
  byte in_stack_ffffffffffffff2e;
  byte in_stack_ffffffffffffff2f;
  undefined4 in_stack_ffffffffffffff30;
  uint uVar9;
  undefined4 in_stack_ffffffffffffff34;
  uint uVar10;
  uint local_c8;
  uint local_c4;
  uint local_c0;
  uint local_bc;
  byte local_a3;
  byte local_a2;
  byte local_a1;
  uint local_a0;
  uint local_9c;
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  uint local_74;
  byte *local_70;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  byte *local_50;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  uint8_t *local_30;
  uint local_14;
  
  local_14 = in_EDX;
  if (in_EDX == 0) {
    local_14 = 1;
  }
  peVar2 = std::__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x13bccb);
  uVar3 = Image::getPixelFormat(peVar2);
  if (uVar3 == 0x1080001) {
    peVar2 = std::__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x13bcec);
    sVar4 = Image::getWidth(peVar2);
    peVar2 = std::__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x13bd06);
    sVar5 = Image::getXPadding(peVar2);
    std::__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x13bd2e);
    local_30 = Image::getPixels((Image *)0x13bd36);
    local_30 = local_30 + (ulong)(local_14 * in_ECX) + (ulong)(local_14 * in_R8D) * (sVar4 + sVar5);
    local_34 = 0;
    local_38 = 0;
    for (local_3c = 0; local_3c < local_14; local_3c = local_3c + 1) {
      for (local_40 = 0; local_40 < local_14; local_40 = local_40 + 1) {
        local_34 = local_30[local_40] + local_34;
        local_38 = local_38 + 1;
      }
      local_30 = local_30 + sVar4 + sVar5;
    }
    uVar1 = (undefined1)(local_34 / local_38);
    *in_RDI = uVar1;
    in_RDI[1] = uVar1;
    in_RDI[2] = uVar1;
  }
  else {
    peVar2 = std::__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x13be62);
    uVar3 = Image::getPixelFormat(peVar2);
    if (uVar3 == 0x2180014) {
      peVar2 = std::__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x13be83);
      sVar4 = Image::getWidth(peVar2);
      peVar2 = std::__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x13bea1);
      sVar5 = Image::getXPadding(peVar2);
      lVar6 = sVar4 * 3 + sVar5;
      std::__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x13bec9);
      puVar7 = Image::getPixels((Image *)0x13bed1);
      local_50 = puVar7 + (ulong)(local_14 * in_ECX * 3) + (ulong)(local_14 * in_R8D) * lVar6;
      local_54 = 0;
      local_58 = 0;
      local_5c = 0;
      local_60 = 0;
      for (local_64 = 0; local_64 < local_14; local_64 = local_64 + 1) {
        local_70 = local_50;
        for (local_74 = 0; local_74 < local_14; local_74 = local_74 + 1) {
          local_54 = *local_70 + local_54;
          pbVar8 = local_70 + 2;
          local_58 = local_70[1] + local_58;
          local_70 = local_70 + 3;
          local_5c = *pbVar8 + local_5c;
          local_60 = local_60 + 1;
        }
        local_50 = local_50 + lVar6;
      }
      *in_RDI = (char)(local_54 / local_60);
      in_RDI[1] = (char)(local_58 / local_60);
      in_RDI[2] = (char)(local_5c / local_60);
    }
    else {
      peVar2 = std::__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x13c0a8);
      uVar3 = Image::getPixelFormat(peVar2);
      if (uVar3 == 0x20c005a) {
        peVar2 = std::
                 __shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x13c0c9);
        Image::getWidth(peVar2);
        peVar2 = std::
                 __shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x13c0eb);
        Image::getXPadding(peVar2);
        std::__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x13c110);
        Image::getPixels((Image *)0x13c118);
        local_8c = 0;
        local_90 = 0;
        local_94 = 0;
        local_98 = 0;
        for (local_9c = 0; local_9c < local_14; local_9c = local_9c + 1) {
          for (local_a0 = 0; local_a0 < local_14; local_a0 = local_a0 + 1) {
            convYCbCr411toRGB((uint8_t *)
                              CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                              (uint8_t *)
                              CONCAT17(in_stack_ffffffffffffff2f,
                                       CONCAT16(in_stack_ffffffffffffff2e,
                                                CONCAT15(in_stack_ffffffffffffff2d,
                                                         in_stack_ffffffffffffff28))),
                              (int)((ulong)in_stack_ffffffffffffff20 >> 0x20));
            local_8c = local_a3 + local_8c;
            local_90 = local_a2 + local_90;
            local_94 = local_a1 + local_94;
            local_98 = local_98 + 1;
          }
        }
        *in_RDI = (char)(local_8c / local_98);
        in_RDI[1] = (char)(local_90 / local_98);
        in_RDI[2] = (char)(local_94 / local_98);
      }
      else {
        peVar2 = std::
                 __shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x13c249);
        uVar3 = Image::getPixelFormat(peVar2);
        if (uVar3 != 0x210003b) {
          peVar2 = std::
                   __shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x13c266);
          uVar3 = Image::getPixelFormat(peVar2);
          if (uVar3 != 0x2100032) {
            return;
          }
        }
        peVar2 = std::
                 __shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x13c287);
        Image::getWidth(peVar2);
        peVar2 = std::
                 __shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x13c2a8);
        Image::getXPadding(peVar2);
        std::__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<const_rcg::Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x13c2cc);
        Image::getPixels((Image *)0x13c2d4);
        local_bc = 0;
        local_c0 = 0;
        local_c4 = 0;
        local_c8 = 0;
        for (uVar10 = 0; uVar10 < local_14; uVar10 = uVar10 + 1) {
          for (uVar9 = 0; uVar9 < local_14; uVar9 = uVar9 + 1) {
            convYCbCr422toRGB((uint8_t *)CONCAT44(uVar10,uVar9),
                              (uint8_t *)
                              CONCAT17(in_stack_ffffffffffffff2f,
                                       CONCAT16(in_stack_ffffffffffffff2e,
                                                CONCAT15(in_stack_ffffffffffffff2d,
                                                         in_stack_ffffffffffffff28))),
                              (int)((ulong)in_stack_ffffffffffffff20 >> 0x20));
            local_bc = in_stack_ffffffffffffff2d + local_bc;
            local_c0 = in_stack_ffffffffffffff2e + local_c0;
            local_c4 = in_stack_ffffffffffffff2f + local_c4;
            local_c8 = local_c8 + 1;
          }
        }
        *in_RDI = (char)(local_bc / local_c8);
        in_RDI[1] = (char)(local_c0 / local_c8);
        in_RDI[2] = (char)(local_c4 / local_c8);
      }
    }
  }
  return;
}

Assistant:

void getColor(uint8_t rgb[3], const std::shared_ptr<const Image> &img,
              uint32_t ds, uint32_t i, uint32_t k)
{
  if (ds < 1)
    ds = 1;

  i*=ds;
  k*=ds;

  if (img->getPixelFormat() == Mono8) // convert from monochrome
  {
    size_t lstep=img->getWidth()+img->getXPadding();
    const uint8_t *p=img->getPixels()+k*lstep+i;

    uint32_t g=0, n=0;

    for (uint32_t kk=0; kk<ds; kk++)
    {
      for (uint32_t ii=0; ii<ds; ii++)
      {
        g+=p[ii];
        n++;
      }

      p+=lstep;
    }

    rgb[2]=rgb[1]=rgb[0]=static_cast<uint8_t>(g/n);
  }
  else if (img->getPixelFormat() == RGB8) // convert from RGB8
  {
    size_t lstep=3*img->getWidth()+img->getXPadding();
    const uint8_t *p=img->getPixels()+k*lstep+3*i;

    uint32_t r=0;
    uint32_t g=0;
    uint32_t b=0;
    uint32_t n=0;

    for (uint32_t kk=0; kk<ds; kk++)
    {
      const uint8_t *pp=p;
      for (uint32_t ii=0; ii<ds; ii++)
      {
        r+=*pp++;
        g+=*pp++;
        b+=*pp++;
        n++;
      }

      p+=lstep;
    }

    rgb[0]=static_cast<uint8_t>(r/n);
    rgb[1]=static_cast<uint8_t>(g/n);
    rgb[2]=static_cast<uint8_t>(b/n);
  }
  else if (img->getPixelFormat() == YCbCr411_8) // convert from YUV411
  {
    size_t lstep=(img->getWidth()>>2)*6+img->getXPadding();
    const uint8_t *p=img->getPixels()+k*lstep;

    uint32_t r=0;
    uint32_t g=0;
    uint32_t b=0;
    uint32_t n=0;

    for (uint32_t kk=0; kk<ds; kk++)
    {
      for (uint32_t ii=0; ii<ds; ii++)
      {
        uint8_t v[3];
        convYCbCr411toRGB(v, p, static_cast<int>(i+ii));

        r+=v[0];
        g+=v[1];
        b+=v[2];
        n++;
      }

      p+=lstep;
    }

    rgb[0]=static_cast<uint8_t>(r/n);
    rgb[1]=static_cast<uint8_t>(g/n);
    rgb[2]=static_cast<uint8_t>(b/n);
  }
  else if (img->getPixelFormat() == YCbCr422_8 || img->getPixelFormat() == YUV422_8) // convert from YUV422
  {
    size_t lstep=(img->getWidth()>>2)*8+img->getXPadding();
    const uint8_t *p=img->getPixels()+k*lstep;

    uint32_t r=0;
    uint32_t g=0;
    uint32_t b=0;
    uint32_t n=0;

    for (uint32_t kk=0; kk<ds; kk++)
    {
      for (uint32_t ii=0; ii<ds; ii++)
      {
        uint8_t v[3];
        convYCbCr422toRGB(v, p, static_cast<int>(i+ii));

        r+=v[0];
        g+=v[1];
        b+=v[2];
        n++;
      }

      p+=lstep;
    }

    rgb[0]=static_cast<uint8_t>(r/n);
    rgb[1]=static_cast<uint8_t>(g/n);
    rgb[2]=static_cast<uint8_t>(b/n);
  }
}